

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trw.cpp
# Opt level: O0

double __thiscall libDAI::TRW::calc_rho_descent(TRW *this)

{
  ulong uVar1;
  size_t sVar2;
  bool bVar3;
  long *plVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 *puVar7;
  mapped_type *pmVar8;
  pointer ppVar9;
  long *plVar10;
  reference pDVar11;
  long *in_RDI;
  Real RVar12;
  const_iterator e_1;
  double MinSpanningTreeWeight;
  size_t j_1;
  size_t i_1;
  DEdgeVec MST;
  iterator e;
  double w;
  Var v_j;
  Var v_i;
  size_t j;
  size_t i;
  double maxWeight;
  WeightedGraph<double> wg;
  map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
  *in_stack_fffffffffffffd18;
  double dVar13;
  TFactor<double> *in_stack_fffffffffffffd20;
  Var *in_stack_fffffffffffffd28;
  __normal_iterator<const_libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
  *this_00;
  VarSet *in_stack_fffffffffffffd30;
  key_type *in_stack_fffffffffffffd58;
  map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
  *in_stack_fffffffffffffd60;
  UEdge local_1c8;
  UEdge local_1b8;
  DEdge *local_1a8;
  DEdge *local_1a0;
  __normal_iterator<const_libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
  local_198;
  double local_190;
  UEdge local_188;
  undefined1 local_178 [32];
  ulong local_158;
  ulong local_150;
  TFactor<double> *in_stack_fffffffffffffed0;
  _Self local_128;
  _Self local_120;
  UEdge local_118;
  undefined1 local_108 [32];
  WeightedGraph<double> *in_stack_ffffffffffffff18;
  undefined1 local_a8 [32];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  ulong local_60;
  ulong local_48;
  Real local_40;
  
  WeightedGraph<double>::WeightedGraph((WeightedGraph<double> *)0xba220c);
  local_40 = 0.0;
  local_48 = 0;
  while( true ) {
    uVar6 = local_48;
    plVar4 = (long *)(**(code **)(*in_RDI + 0x28))();
    uVar5 = (**(code **)(*plVar4 + 0x28))();
    uVar1 = local_48;
    if (uVar5 <= uVar6) break;
    while( true ) {
      local_60 = uVar1 + 1;
      uVar1 = local_60;
      plVar4 = (long *)(**(code **)(*in_RDI + 0x28))();
      uVar6 = (**(code **)(*plVar4 + 0x28))();
      if (uVar6 <= uVar1) break;
      plVar4 = (long *)(**(code **)(*in_RDI + 0x28))();
      puVar7 = (undefined8 *)(**(code **)(*plVar4 + 0x30))(plVar4,local_48);
      local_78 = *puVar7;
      uStack_70 = puVar7[1];
      plVar4 = (long *)(**(code **)(*in_RDI + 0x28))();
      puVar7 = (undefined8 *)(**(code **)(*plVar4 + 0x30))(plVar4,local_60);
      local_88 = *puVar7;
      uStack_80 = puVar7[1];
      plVar4 = (long *)(**(code **)(*in_RDI + 0x28))();
      (**(code **)(*plVar4 + 0x70))(local_a8,plVar4,&local_78);
      bVar3 = VarSet::operator&&(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      VarSet::~VarSet((VarSet *)0xba2406);
      uVar1 = local_60;
      if (bVar3) {
        libDAI::operator|(in_stack_fffffffffffffd28,(Var *)in_stack_fffffffffffffd20);
        (**(code **)(*in_RDI + 0x58))(&stack0xffffffffffffff18,in_RDI,local_108);
        RVar12 = MutualInfo<double>(in_stack_fffffffffffffed0);
        TFactor<double>::~TFactor(in_stack_fffffffffffffd20);
        VarSet::~VarSet((VarSet *)0xba248a);
        if (local_40 < RVar12) {
          local_40 = RVar12;
        }
        UEdge::UEdge(&local_118,local_48,local_60);
        pmVar8 = std::
                 map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
                 ::operator[](in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
        *pmVar8 = -RVar12;
        uVar1 = local_60;
      }
    }
    local_48 = local_48 + 1;
  }
  local_120._M_node =
       (_Base_ptr)
       std::
       map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
       ::begin(in_stack_fffffffffffffd18);
  while( true ) {
    local_128._M_node =
         (_Base_ptr)
         std::
         map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
         ::end(in_stack_fffffffffffffd18);
    bVar3 = std::operator!=(&local_120,&local_128);
    RVar12 = local_40;
    if (!bVar3) break;
    ppVar9 = std::_Rb_tree_iterator<std::pair<const_libDAI::UEdge,_double>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_libDAI::UEdge,_double>_> *)0xba265f);
    ppVar9->second = RVar12 + ppVar9->second;
    std::_Rb_tree_iterator<std::pair<const_libDAI::UEdge,_double>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_libDAI::UEdge,_double>_> *)
               in_stack_fffffffffffffd28,(int)((ulong)in_stack_fffffffffffffd20 >> 0x20));
  }
  MinSpanningTreePrims<double>(in_stack_ffffffffffffff18);
  local_150 = 0;
  while( true ) {
    uVar1 = local_150;
    plVar4 = (long *)(**(code **)(*in_RDI + 0x28))();
    uVar6 = (**(code **)(*plVar4 + 0x28))();
    sVar2 = local_150;
    if (uVar6 <= uVar1) break;
    while( true ) {
      local_158 = sVar2 + 1;
      uVar1 = local_158;
      plVar4 = (long *)(**(code **)(*in_RDI + 0x28))();
      uVar6 = (**(code **)(*plVar4 + 0x28))();
      if (uVar6 <= uVar1) break;
      plVar4 = (long *)(**(code **)(*in_RDI + 0x28))();
      plVar10 = (long *)(**(code **)(*in_RDI + 0x28))();
      in_stack_fffffffffffffd60 =
           (map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
            *)(**(code **)(*plVar10 + 0x30))(plVar10,local_150);
      (**(code **)(*plVar4 + 0x70))(local_178,plVar4,in_stack_fffffffffffffd60);
      in_stack_fffffffffffffd58 = (key_type *)(**(code **)(*in_RDI + 0x28))();
      (**(code **)(in_stack_fffffffffffffd58->n1 + 0x30))(in_stack_fffffffffffffd58,local_158);
      bVar3 = VarSet::operator&&(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      VarSet::~VarSet((VarSet *)0xba282c);
      sVar2 = local_158;
      if (bVar3) {
        UEdge::UEdge(&local_188,local_150,local_158);
        pmVar8 = std::
                 map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
                 ::operator[](in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
        *pmVar8 = 0.0;
        sVar2 = local_158;
      }
    }
    local_150 = local_150 + 1;
  }
  local_190 = 0.0;
  local_1a0 = (DEdge *)std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::begin
                                 ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)
                                  in_stack_fffffffffffffd18);
  __gnu_cxx::
  __normal_iterator<libDAI::DEdge_const*,std::vector<libDAI::DEdge,std::allocator<libDAI::DEdge>>>::
  __normal_iterator<libDAI::DEdge*>
            ((__normal_iterator<const_libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
              *)in_stack_fffffffffffffd20,
             (__normal_iterator<libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
              *)in_stack_fffffffffffffd18);
  while( true ) {
    local_1a8 = (DEdge *)std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::end
                                   ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)
                                    in_stack_fffffffffffffd18);
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
                        *)in_stack_fffffffffffffd20,
                       (__normal_iterator<libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
                        *)in_stack_fffffffffffffd18);
    if (!bVar3) break;
    pDVar11 = __gnu_cxx::
              __normal_iterator<const_libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
              ::operator*(&local_198);
    UEdge::UEdge(&local_1b8,pDVar11);
    in_stack_fffffffffffffd30 =
         (VarSet *)
         std::
         map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
         ::operator[](in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    local_190 = local_190 -
                ((double)(in_stack_fffffffffffffd30->_vars).
                         super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                         super__Vector_impl_data._M_start - local_40);
    this_00 = (__normal_iterator<const_libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
               *)(in_RDI + 0x38);
    pDVar11 = __gnu_cxx::
              __normal_iterator<const_libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
              ::operator*(&local_198);
    UEdge::UEdge(&local_1c8,pDVar11);
    in_stack_fffffffffffffd20 =
         (TFactor<double> *)
         std::
         map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
         ::operator[](in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    (in_stack_fffffffffffffd20->_vs)._vars.
    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x3ff0000000000000;
    __gnu_cxx::
    __normal_iterator<const_libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
    ::operator++(this_00,(int)((ulong)in_stack_fffffffffffffd20 >> 0x20));
  }
  dVar13 = local_190;
  std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::~vector
            ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)in_stack_fffffffffffffd30);
  WeightedGraph<double>::~WeightedGraph((WeightedGraph<double> *)0xba2a79);
  return dVar13;
}

Assistant:

double TRW::calc_rho_descent() {
        WeightedGraph<double> wg;
        // construct weighted graph with as weights the mutual information
        // according to the beliefs and take the maximum spanning tree to
        // find the descent direction
        double maxWeight = 0.0;
        for( size_t i = 0; i < grm().nrVars(); i++ )
            for( size_t j = i+1; j < grm().nrVars(); j++ ) {
                Var v_i = grm().var(i);
                Var v_j = grm().var(j);
                if( grm().delta(v_i) && v_j ) {
                    double w = MutualInfo( belief( v_i | v_j ) );
                    if( w > maxWeight )
                        maxWeight = w;
                    wg[UEdge(i,j)] = -w;
                }
            }
        // Add constant because BGL cannot handle negative weights
        for( WeightedGraph<double>::iterator e = wg.begin(); e != wg.end(); e++ )
            e->second += maxWeight;
            
        DEdgeVec MST = MinSpanningTreePrims( wg );

        for( size_t i = 0; i < grm().nrVars(); i++ )
            for( size_t j = i+1; j < grm().nrVars(); j++ )
                if( grm().delta(grm().var(i)) && grm().var(j) )
                    _rho_e_descent[UEdge(i,j)] = 0.0;
        double MinSpanningTreeWeight = 0.0;
        for( DEdgeVec::const_iterator e = MST.begin(); e != MST.end(); e++ ) {
            MinSpanningTreeWeight -= (wg[UEdge(*e)] - maxWeight);
            _rho_e_descent[UEdge(*e)] = 1.0;
        }

        assert( MinSpanningTreeWeight > 0.0 );
        return MinSpanningTreeWeight;
    }